

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

block_state deflate_rle(deflate_state *s,int flush)

{
  Bytef BVar1;
  uint uVar2;
  byte bVar3;
  Bytef *pBVar4;
  bool bVar5;
  Bytef *local_70;
  Bytef *local_60;
  uch cc;
  ush dist;
  uch len;
  Bytef *strend;
  Bytef *scan;
  uInt prev;
  int bflush;
  int flush_local;
  deflate_state *s_local;
  
  do {
    if (s->lookahead < 0x102) {
      fill_window(s);
      if ((s->lookahead < 0x102) && (flush == 0)) {
        return need_more;
      }
      if (s->lookahead == 0) {
        if (s->block_start < 0) {
          local_70 = (Bytef *)0x0;
        }
        else {
          local_70 = s->window + (s->block_start & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)local_70,(ulong)s->strstart - s->block_start,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          if (flush != 4) {
            return need_more;
          }
          return finish_started;
        }
        if (flush != 4) {
          return block_done;
        }
        return finish_done;
      }
    }
    s->match_length = 0;
    if ((2 < s->lookahead) && (s->strstart != 0)) {
      pBVar4 = s->window + s->strstart;
      BVar1 = pBVar4[-1];
      if ((BVar1 == *pBVar4) && ((BVar1 == pBVar4[1] && (strend = pBVar4 + 2, BVar1 == pBVar4[2]))))
      {
        do {
          bVar5 = false;
          pBVar4 = strend + 1;
          if (BVar1 == strend[1]) {
            bVar5 = false;
            pBVar4 = strend + 2;
            if (BVar1 == strend[2]) {
              bVar5 = false;
              pBVar4 = strend + 3;
              if (BVar1 == strend[3]) {
                bVar5 = false;
                pBVar4 = strend + 4;
                if (BVar1 == strend[4]) {
                  bVar5 = false;
                  pBVar4 = strend + 5;
                  if (BVar1 == strend[5]) {
                    bVar5 = false;
                    pBVar4 = strend + 6;
                    if (BVar1 == strend[6]) {
                      bVar5 = false;
                      pBVar4 = strend + 7;
                      if (BVar1 == strend[7]) {
                        pBVar4 = strend + 8;
                        bVar5 = false;
                        if (BVar1 == strend[8]) {
                          bVar5 = pBVar4 < s->window + (ulong)s->strstart + 0x102;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          strend = pBVar4;
        } while (bVar5);
        s->match_length = 0x102 - ((int)(s->window + (ulong)s->strstart + 0x102) - (int)strend);
        if (s->lookahead < s->match_length) {
          s->match_length = s->lookahead;
        }
      }
    }
    if (s->match_length < 3) {
      bVar3 = s->window[s->strstart];
      s->d_buf[s->last_lit] = 0;
      uVar2 = s->last_lit;
      s->last_lit = uVar2 + 1;
      s->l_buf[uVar2] = bVar3;
      s->dyn_ltree[bVar3].fc.freq = s->dyn_ltree[bVar3].fc.freq + 1;
      bVar5 = s->last_lit == s->lit_bufsize - 1;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
    }
    else {
      bVar3 = (char)s->match_length - 3;
      s->d_buf[s->last_lit] = 1;
      uVar2 = s->last_lit;
      s->last_lit = uVar2 + 1;
      s->l_buf[uVar2] = bVar3;
      s->dyn_ltree[(int)(""[bVar3] + 0x101)].fc.freq =
           s->dyn_ltree[(int)(""[bVar3] + 0x101)].fc.freq + 1;
      s->dyn_dtree[0].fc.freq = s->dyn_dtree[0].fc.freq + 1;
      bVar5 = s->last_lit == s->lit_bufsize - 1;
      s->lookahead = s->lookahead - s->match_length;
      s->strstart = s->match_length + s->strstart;
      s->match_length = 0;
    }
    if (bVar5) {
      if (s->block_start < 0) {
        local_60 = (Bytef *)0x0;
      }
      else {
        local_60 = s->window + (s->block_start & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)local_60,(ulong)s->strstart - s->block_start,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_rle(deflate_state *s, int flush)
{
    int bflush;             /* set if current block must be flushed */
    uInt prev;              /* byte at distance one to match */
    Bytef *scan, *strend;   /* scan goes up to strend for length of run */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the longest encodable run.
         */
        if (s->lookahead < MAX_MATCH) {
            fill_window(s);
            if (s->lookahead < MAX_MATCH && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* See how many times the previous byte repeats */
        s->match_length = 0;
        if (s->lookahead >= MIN_MATCH && s->strstart > 0) {
            scan = s->window + s->strstart - 1;
            prev = *scan;
            if (prev == *++scan && prev == *++scan && prev == *++scan) {
                strend = s->window + s->strstart + MAX_MATCH;
                do {
                } while (prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         prev == *++scan && prev == *++scan &&
                         scan < strend);
                s->match_length = MAX_MATCH - (int)(strend - scan);
                if (s->match_length > s->lookahead)
                    s->match_length = s->lookahead;
            }
        }

        /* Emit match if have run of MIN_MATCH or longer, else emit literal */
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->strstart - 1, s->match_length);

            _tr_tally_dist(s, 1, s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;
            s->strstart += s->match_length;
            s->match_length = 0;
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}